

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O0

expression * mathCore::binary_or(expression *a,expression *b)

{
  expression *this;
  expression *exp;
  expression *b_local;
  expression *a_local;
  
  exp = b;
  b_local = a;
  this = (expression *)operator_new(0x38);
  expression::expression(this);
  this->FLAGS = 0x20;
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
            (&this->contents,&b_local);
  std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
            (&this->contents,&exp);
  return this;
}

Assistant:

expression* mathCore::binary_or(expression* a, expression* b) {
	expression* exp = new expression;
	exp->FLAGS = F_OR;
	exp->contents.insert(a);
	exp->contents.insert(b);
	return exp;
}